

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Int64ToDoubleMap::MergePartialFromCodedStream
          (Int64ToDoubleMap *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  pair<int,_int> pVar7;
  uint tag;
  ulong uVar8;
  Map<long,_double> *pMVar9;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
  parser;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
  local_58;
  
  pMVar9 = &(this->map_).map_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001cef6a;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001cef6a:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    tag = (uint)uVar8;
    if (((uVar8 & 0x100000000) == 0) || ((char)uVar8 != '\n' || (tag & 0xfffffff8) != 8)) {
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
      if (!bVar4) goto LAB_001cf083;
LAB_001ceff9:
      iVar6 = 0;
    }
    else {
      local_58.entry_.ptr_ =
           (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
            *)0x0;
      puVar3 = input->buffer_;
      local_58.mf_ = &this->map_;
      local_58.map_ = pMVar9;
      if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
LAB_001cf013:
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if (((long)pVar7 < 0) ||
           (bVar4 = google::protobuf::internal::
                    MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
                    ::
                    Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
                    ::MergePartialFromCodedStream(&local_58,input), !bVar4)) goto LAB_001cf077;
        bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar7.first);
        iVar6 = 6;
        if (bVar4) {
          iVar6 = 0;
        }
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (-1 < iVar6) goto LAB_001cf013;
LAB_001cf077:
        iVar6 = 6;
        bVar4 = false;
      }
      if (local_58.entry_.ptr_ !=
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
           *)0x0) {
        (*((local_58.entry_.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
      }
      if (bVar4 != false) goto LAB_001ceff9;
    }
  } while (iVar6 == 0);
  bVar4 = true;
  if (iVar6 == 6) {
LAB_001cf083:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Int64ToDoubleMap::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Int64ToDoubleMap)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // map<int64, double> map = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          Int64ToDoubleMap_MapEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              Int64ToDoubleMap_MapEntry,
              ::google::protobuf::int64, double,
              ::google::protobuf::internal::WireFormatLite::TYPE_INT64,
              ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE,
              0 >,
            ::google::protobuf::Map< ::google::protobuf::int64, double > > parser(&map_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Int64ToDoubleMap)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Int64ToDoubleMap)
  return false;
#undef DO_
}